

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute.cpp
# Opt level: O0

TConstUnion * __thiscall
glslang::TAttributeArgs::getConstUnion(TAttributeArgs *this,TBasicType basicType,int argNum)

{
  int iVar1;
  TBasicType TVar2;
  undefined4 extraout_var;
  size_type sVar3;
  undefined4 extraout_var_00;
  const_reference ppTVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TConstUnionArray *this_00;
  TConstUnion *constVal;
  int argNum_local;
  TBasicType basicType_local;
  TAttributeArgs *this_local;
  
  if (this->args == (TIntermAggregate *)0x0) {
    this_local = (TAttributeArgs *)0x0;
  }
  else {
    iVar1 = (*(this->args->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x33])();
    sVar3 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size
                      ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                       CONCAT44(extraout_var,iVar1));
    if (argNum < (int)sVar3) {
      iVar1 = (*(this->args->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x33])();
      ppTVar4 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                          ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                           CONCAT44(extraout_var_00,iVar1),(long)argNum);
      iVar1 = (*(*ppTVar4)->_vptr_TIntermNode[5])();
      if (CONCAT44(extraout_var_01,iVar1) == 0) {
        this_local = (TAttributeArgs *)0x0;
      }
      else {
        iVar1 = (*(this->args->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x33])();
        ppTVar4 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                            ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                             CONCAT44(extraout_var_02,iVar1),(long)argNum);
        iVar1 = (*(*ppTVar4)->_vptr_TIntermNode[5])();
        this_00 = TIntermConstantUnion::getConstArray
                            ((TIntermConstantUnion *)CONCAT44(extraout_var_03,iVar1));
        this_local = (TAttributeArgs *)TConstUnionArray::operator[](this_00,0);
        if (((TConstUnion *)this_local == (TConstUnion *)0x0) ||
           (TVar2 = TConstUnion::getType((TConstUnion *)this_local), TVar2 != basicType)) {
          this_local = (TAttributeArgs *)0x0;
        }
      }
    }
    else {
      this_local = (TAttributeArgs *)0x0;
    }
  }
  return (TConstUnion *)this_local;
}

Assistant:

const TConstUnion* TAttributeArgs::getConstUnion(TBasicType basicType, int argNum) const
{
    if (args == nullptr)
        return nullptr;

    if (argNum >= (int)args->getSequence().size())
        return nullptr;

    if (args->getSequence()[argNum]->getAsConstantUnion() == nullptr)
        return nullptr;

    const TConstUnion* constVal = &args->getSequence()[argNum]->getAsConstantUnion()->getConstArray()[0];
    if (constVal == nullptr || constVal->getType() != basicType)
        return nullptr;

    return constVal;
}